

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O0

void __thiscall
UnifiedRegex::SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::
SyncToLiteralAndBackupInstT
          (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *this,InstTag tag,
          CharCount offset,CharCount length,CountDomain *backup)

{
  CountDomain *backup_local;
  CharCount length_local;
  CharCount offset_local;
  InstTag tag_local;
  SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *this_local;
  
  Inst::Inst(&this->super_Inst,tag);
  EquivScannerMixinT<1U>::EquivScannerMixinT(&this->super_EquivScannerMixinT<1U>,offset,length);
  BackupMixin::BackupMixin(&this->super_BackupMixin,backup);
  return;
}

Assistant:

SyncToLiteralAndBackupInstT(InstTag tag, CharCount offset, CharCount length, const CountDomain& backup) : Inst(tag), ScannerT(offset, length), BackupMixin(backup) {}